

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

bool __thiscall
Inline::InlineCallBuiltInTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo *inlineeData,FunctionJITTimeInfo *callFuncInfo,
          Instr *callTargetLdInstr,OpCode inlineOpCode,StackSym *symThis,uint recursiveInlineDepth,
          bool isCallInstanceFunction,Instr **returnInstr)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  ByteCodeUsesInstr *this_00;
  ProfiledInstr *pPVar5;
  Instr *pIVar6;
  undefined4 *puVar7;
  Instr *local_60;
  Instr *unused;
  Instr *local_50;
  StackSym *local_48;
  FunctionJITTimeInfo *local_40;
  bool local_34;
  bool local_33;
  OpCode local_32;
  bool isInlined;
  
  local_32 = callInstr->m_opcode;
  unused = (Instr *)inlineeData;
  local_50 = callTargetLdInstr;
  local_48 = IR::Opnd::GetStackSym(callInstr->m_src1);
  bVar1 = callInstr->m_src1->field_0xb;
  bVar3 = TryOptimizeCallInstrWithFixedMethod
                    (this,callInstr,callFuncInfo,false,true,false,true,&local_34,false,0);
  if (bVar3) {
    this_00 = IR::ByteCodeUsesInstr::New(callInstr);
    local_40 = inlinerData;
    IR::ByteCodeUsesInstr::SetRemovedOpndSymbol
              (this_00,(bool)((bVar1 & 8) >> 3),(local_48->super_Sym).m_id);
    IR::Instr::InsertBefore(callInstr,&this_00->super_Instr);
    callInstr->m_opcode = local_32;
    IR::Instr::ReplaceSrc1(callInstr,local_50->m_dst);
    local_60 = (Instr *)0x0;
    AdjustArgoutsForCallTargetInlining(this,callInstr,&local_60,isCallInstanceFunction);
    local_33 = false;
    pPVar5 = IR::Instr::AsProfiledInstr(callInstr);
    pIVar6 = InlineBuiltInFunction
                       (this,callInstr,(FunctionJITTimeInfo *)unused,inlineOpCode,local_40,symThis,
                        &local_33,(uint)(pPVar5->u).field_3.fldInfoData.f1,recursiveInlineDepth,
                        &this_00->super_Instr);
    *returnInstr = pIVar6;
    if (local_33 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0xdd3,"(isInlined)","isInlined");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
  }
  return bVar3;
}

Assistant:

bool
Inline::InlineCallBuiltInTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo* inlineeData, const FunctionJITTimeInfo *callFuncInfo, IR::Instr * callTargetLdInstr, Js::OpCode inlineOpCode,
    const StackSym *symThis, uint recursiveInlineDepth, bool isCallInstanceFunction, IR::Instr ** returnInstr)
{
    Js::OpCode originalCallOpCode = callInstr->m_opcode;
    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();

    bool safeThis = false;
    if (!TryOptimizeCallInstrWithFixedMethod(callInstr, callFuncInfo, false /*isPolymorphic*/, true /*isBuiltIn*/, false /*isCtor*/, true /*isInlined*/, safeThis))
    {
        return false;
    }

    IR::ByteCodeUsesInstr * useCallTargetInstr = IR::ByteCodeUsesInstr::New(callInstr);
    useCallTargetInstr->SetRemovedOpndSymbol(originalCallTargetOpndJITOpt, originalCallTargetStackSym->m_id);
    callInstr->InsertBefore(useCallTargetInstr);

    callInstr->m_opcode = originalCallOpCode;
    callInstr->ReplaceSrc1(callTargetLdInstr->GetDst());

    IR::Instr * unused = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &unused, isCallInstanceFunction);

    bool isInlined = false;
    Js::ProfileId callSiteId = static_cast<Js::ProfileId>(callInstr->AsProfiledInstr()->u.profileId);
    *returnInstr = InlineBuiltInFunction(callInstr, inlineeData, inlineOpCode, inlinerData, symThis, &isInlined, callSiteId, recursiveInlineDepth, useCallTargetInstr);
    Assert(isInlined);

    return true;
}